

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_pipeline.cpp
# Opt level: O0

string * format_map_abi_cxx11_
                   (unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                    *map)

{
  bool bVar1;
  type *ptVar2;
  type *ptVar3;
  ostream *poVar4;
  undefined8 in_RSI;
  string *in_RDI;
  type *j;
  type *i;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  *__range1;
  ostringstream oss;
  unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  *in_stack_fffffffffffffe08;
  _Node_iterator_base<std::pair<const_char,_unsigned_long>,_false> local_1a0;
  _Node_iterator_base<std::pair<const_char,_unsigned_long>,_false> local_198;
  undefined8 local_190;
  ostringstream local_188 [376];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_190 = local_10;
  local_198._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
       ::begin(in_stack_fffffffffffffe08);
  local_1a0._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
       ::end(in_stack_fffffffffffffe08);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_198,&local_1a0);
    if (!bVar1) break;
    std::__detail::_Node_const_iterator<std::pair<const_char,_unsigned_long>,_false,_false>::
    operator*((_Node_const_iterator<std::pair<const_char,_unsigned_long>,_false,_false> *)0x10592b);
    ptVar2 = std::get<0ul,char_const,unsigned_long>((pair<const_char,_unsigned_long> *)0x10593a);
    ptVar3 = std::get<1ul,char_const,unsigned_long>((pair<const_char,_unsigned_long> *)0x105949);
    poVar4 = std::operator<<((ostream *)local_188,*ptVar2);
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*ptVar3);
    std::operator<<(poVar4,' ');
    std::__detail::_Node_const_iterator<std::pair<const_char,_unsigned_long>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_char,_unsigned_long>,_false,_false> *)poVar4);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string format_map(const std::unordered_map<char, size_t>& map) {
  std::ostringstream oss;
  for(const auto& [i, j] : map) {
    oss << i << ':' << j << ' ';
  }
  return oss.str();
}